

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidget::isEnabledTo(QWidget *this,QWidget *ancestor)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QWidget *w;
  undefined4 in_stack_ffffffffffffffe0;
  WidgetAttribute in_stack_ffffffffffffffe4;
  WidgetAttribute attribute;
  
  while( true ) {
    bVar1 = testAttribute(in_RDI,in_stack_ffffffffffffffe4);
    attribute = in_stack_ffffffffffffffe4 & 0xffffff;
    if (!bVar1) {
      bVar1 = isWindow((QWidget *)
                       (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                       0xffffffffffffff));
      attribute = attribute & 0xffffff;
      if (!bVar1) {
        pQVar2 = parentWidget((QWidget *)0x368a19);
        attribute = attribute & 0xffffff;
        if (pQVar2 != (QWidget *)0x0) {
          pQVar2 = parentWidget((QWidget *)0x368a32);
          attribute = CONCAT13(pQVar2 != in_RSI,(int3)attribute);
        }
      }
    }
    if ((char)(attribute >> 0x18) == '\0') break;
    in_RDI = parentWidget((QWidget *)0x368a52);
    in_stack_ffffffffffffffe4 = attribute;
  }
  bVar1 = testAttribute(in_RDI,attribute);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool QWidget::isEnabledTo(const QWidget *ancestor) const
{
    const QWidget * w = this;
    while (!w->testAttribute(Qt::WA_ForceDisabled)
            && !w->isWindow()
            && w->parentWidget()
            && w->parentWidget() != ancestor)
        w = w->parentWidget();
    return !w->testAttribute(Qt::WA_ForceDisabled);
}